

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

void ngram_search_calc_beams(ngram_search_t *ngs)

{
  ps_config_t *config_00;
  acmod_t *paVar1;
  logmath_t *plVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  acmod_t *acmod;
  cmd_ln_t *config;
  ngram_search_t *ngs_local;
  
  config_00 = (ngs->base).config;
  paVar1 = (ngs->base).acmod;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"beam");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->beam = iVar3 >> 10;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"wbeam");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->wbeam = iVar3 >> 10;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"pbeam");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->pbeam = iVar3 >> 10;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"lpbeam");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->lpbeam = iVar3 >> 10;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"lponlybeam");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->lponlybeam = iVar3 >> 10;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"fwdflatbeam");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->fwdflatbeam = iVar3 >> 10;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"fwdflatwbeam");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->fwdflatwbeam = iVar3 >> 10;
  lVar5 = ps_config_int(config_00,"maxwpf");
  ngs->maxwpf = (int32)lVar5;
  lVar5 = ps_config_int(config_00,"maxhmmpf");
  ngs->maxhmmpf = (int32)lVar5;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"wip");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->wip = iVar3 >> 10;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"nwpen");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->nwpen = iVar3 >> 10;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"pip");
  iVar3 = logmath_log(plVar2,(float64)dVar6);
  ngs->pip = iVar3 >> 10;
  iVar3 = ngs->pip;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"silprob");
  iVar4 = logmath_log(plVar2,(float64)dVar6);
  ngs->silpen = iVar3 + (iVar4 >> 10);
  iVar3 = ngs->pip;
  plVar2 = paVar1->lmath;
  dVar6 = ps_config_float(config_00,"fillprob");
  iVar4 = logmath_log(plVar2,(float64)dVar6);
  ngs->fillpen = iVar3 + (iVar4 >> 10);
  dVar6 = ps_config_float(config_00,"fwdflatlw");
  dVar7 = ps_config_float(config_00,"lw");
  ngs->fwdflat_fwdtree_lw_ratio = (float32)(float)(dVar6 / dVar7);
  dVar6 = ps_config_float(config_00,"bestpathlw");
  dVar7 = ps_config_float(config_00,"lw");
  ngs->bestpath_fwdtree_lw_ratio = (float32)(float)(dVar6 / dVar7);
  dVar6 = ps_config_float(config_00,"ascale");
  ngs->ascale = (float32)(float)(1.0 / dVar6);
  return;
}

Assistant:

static void
ngram_search_calc_beams(ngram_search_t *ngs)
{
    cmd_ln_t *config;
    acmod_t *acmod;

    config = ps_search_config(ngs);
    acmod = ps_search_acmod(ngs);

    /* Log beam widths. */
    ngs->beam = logmath_log(acmod->lmath, ps_config_float(config, "beam"))>>SENSCR_SHIFT;
    ngs->wbeam = logmath_log(acmod->lmath, ps_config_float(config, "wbeam"))>>SENSCR_SHIFT;
    ngs->pbeam = logmath_log(acmod->lmath, ps_config_float(config, "pbeam"))>>SENSCR_SHIFT;
    ngs->lpbeam = logmath_log(acmod->lmath, ps_config_float(config, "lpbeam"))>>SENSCR_SHIFT;
    ngs->lponlybeam = logmath_log(acmod->lmath, ps_config_float(config, "lponlybeam"))>>SENSCR_SHIFT;
    ngs->fwdflatbeam = logmath_log(acmod->lmath, ps_config_float(config, "fwdflatbeam"))>>SENSCR_SHIFT;
    ngs->fwdflatwbeam = logmath_log(acmod->lmath, ps_config_float(config, "fwdflatwbeam"))>>SENSCR_SHIFT;

    /* Absolute pruning parameters. */
    ngs->maxwpf = ps_config_int(config, "maxwpf");
    ngs->maxhmmpf = ps_config_int(config, "maxhmmpf");

    /* Various penalties which may or may not be useful. */
    ngs->wip = logmath_log(acmod->lmath, ps_config_float(config, "wip")) >>SENSCR_SHIFT;
    ngs->nwpen = logmath_log(acmod->lmath, ps_config_float(config, "nwpen")) >>SENSCR_SHIFT;
    ngs->pip = logmath_log(acmod->lmath, ps_config_float(config, "pip")) >>SENSCR_SHIFT;
    ngs->silpen = ngs->pip
        + (logmath_log(acmod->lmath, ps_config_float(config, "silprob"))>>SENSCR_SHIFT);
    ngs->fillpen = ngs->pip
        + (logmath_log(acmod->lmath, ps_config_float(config, "fillprob"))>>SENSCR_SHIFT);

    /* Language weight ratios for fwdflat and bestpath search. */
    ngs->fwdflat_fwdtree_lw_ratio =
        ps_config_float(config, "fwdflatlw")
        / ps_config_float(config, "lw");
    ngs->bestpath_fwdtree_lw_ratio =
        ps_config_float(config, "bestpathlw")
        / ps_config_float(config, "lw");

    /* Acoustic score scale for posterior probabilities. */
    ngs->ascale = 1.0 / ps_config_float(config, "ascale");
}